

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFileCollectingErrors
          (DescriptorPool *this,FileDescriptorProto *proto,ErrorCollector *error_collector)

{
  LogMessage *pLVar1;
  FileDescriptor *pFVar2;
  LogFinisher local_131;
  DescriptorBuilder local_130;
  
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_130,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0xdd7);
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_130,"CHECK failed: fallback_database_ == nullptr: ");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,
                        "Cannot call BuildFile on a DescriptorPool that uses a DescriptorDatabase.  You must instead find a way to get your file into the underlying database."
                       );
    internal::LogFinisher::operator=(&local_131,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)&local_130);
  }
  if (this->mutex_ != (WrappedMutex *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_130,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0xddb);
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_130,"CHECK failed: mutex_ == nullptr: ");
    internal::LogFinisher::operator=(&local_131,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)&local_130);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(((this->tables_)._M_t.
             super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl)
           ->known_bad_symbols_)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(((this->tables_)._M_t.
             super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl)
           ->known_bad_files_)._M_h);
  DescriptorBuilder::DescriptorBuilder
            (&local_130,this,
             (this->tables_)._M_t.
             super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl,
             error_collector);
  pFVar2 = DescriptorBuilder::BuildFile(&local_130,proto);
  DescriptorBuilder::~DescriptorBuilder(&local_130);
  return pFVar2;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFileCollectingErrors(
    const FileDescriptorProto& proto, ErrorCollector* error_collector) {
  GOOGLE_CHECK(fallback_database_ == nullptr)
      << "Cannot call BuildFile on a DescriptorPool that uses a "
         "DescriptorDatabase.  You must instead find a way to get your file "
         "into the underlying database.";
  GOOGLE_CHECK(mutex_ == nullptr);  // Implied by the above GOOGLE_CHECK.
  tables_->known_bad_symbols_.clear();
  tables_->known_bad_files_.clear();
  return DescriptorBuilder(this, tables_.get(), error_collector)
      .BuildFile(proto);
}